

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O1

void testwin5(wins *wins_ar,int ar_len)

{
  Am_Drawonable *pAVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  Am_Style local_50 [8];
  Am_Drawonable *d5_array [3];
  
  uVar2 = (ulong)(uint)ar_len;
  puts("Entering testwin5:");
  printf("  Hit RETURN to create an invisible locally-scoped window:");
  getchar();
  if (0 < ar_len) {
    lVar4 = 0;
    do {
      pAVar1 = (&wins_ar->root)[lVar4];
      Am_Style::Am_Style(local_50,(Am_Style *)&Am_No_Style);
      uVar3 = (*(code *)**(undefined8 **)pAVar1)
                        (pAVar1,10,0x28,200,200,"D5","D5 Icon",0,0,local_50,0,1,1,0,0,1,0,0,1,0);
      *(undefined8 *)((long)d5_array + lVar4) = uVar3;
      Am_Style::~Am_Style(local_50);
      lVar4 = lVar4 + 8;
    } while (uVar2 * 8 != lVar4);
  }
  printf("  Hit RETURN to toggle visibility of locally-scoped window: ");
  getchar();
  if (0 < ar_len) {
    uVar5 = 0;
    do {
      (**(code **)(*(long *)d5_array[uVar5] + 0x70))(d5_array[uVar5],1);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  printf("  Hit RETURN to \"Destroy\" locally-scoped window:");
  getchar();
  if (0 < ar_len) {
    uVar5 = 0;
    do {
      (**(code **)(*(long *)d5_array[uVar5] + 8))();
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  return;
}

Assistant:

void
testwin5(wins *wins_ar, int ar_len)
{
  printf("Entering testwin5:\n");
  printf("  Hit RETURN to create an invisible locally-scoped window:");
  getchar();

  int i;
  Am_Drawonable *d5_array[3]; // Maximum value ar_len could be
  for (i = 0; i < ar_len; i++) {
    d5_array[i] = (wins_ar[i].root)
                      ->Create(10, 40, 200, 200, "D5", "D5 Icon",
                               // visibility
                               false);
  }

  printf("  Hit RETURN to toggle visibility of locally-scoped window: ");
  getchar();
  for (i = 0; i < ar_len; i++) {
    d5_array[i]->Set_Visible(true);
  }

  printf("  Hit RETURN to \"Destroy\" locally-scoped window:");
  getchar();

  for (i = 0; i < ar_len; i++) {
    d5_array[i]->Destroy();
  }
}